

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O3

ostream * tchecker::refdbm::output(ostream *os,db_t *rdbm,reference_clock_variables_t *r)

{
  bool bVar1;
  db_t dVar2;
  ostream *poVar3;
  invalid_argument *this;
  db_t *db;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  db_t cij;
  db_t cji;
  db_t local_8c;
  uint local_88;
  db_t local_84;
  ostream *local_80;
  undefined1 local_78 [36];
  int local_54;
  uint local_50;
  int local_4c;
  uint local_48;
  uint local_44;
  ulong local_40;
  db_t *local_38;
  
  uVar8 = *(stored_size_type *)
           ((long)&(r->super_flat_clock_variables_t).
                   super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._index._key_map.m_flat_tree.m_data + 8);
  local_38 = rdbm;
  if (uVar8 != *(stored_size_type *)
                ((long)&(r->super_flat_clock_variables_t).
                        super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._index._value_map.m_flat_tree.m_data + 8)) {
    __assert_fail("_key_map.size() == _value_map.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                  ,0x90,
                  "size_t tchecker::index_t<unsigned int, std::basic_string<char>>::size() const [KEY = unsigned int, T = std::basic_string<char>]"
                 );
  }
  local_80 = os;
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  uVar7 = (uint)uVar8;
  if (uVar7 != 0) {
    local_54 = uVar7 + 1;
    local_48 = 0;
    bVar1 = true;
    uVar5 = 1;
    uVar8 = uVar8 & 0xffffffff;
    uVar4 = 1;
    do {
      local_40 = (ulong)local_48;
      local_48 = local_48 + 1;
      local_4c = (int)uVar8;
      local_50 = uVar4;
      local_44 = uVar5;
      if (local_48 < uVar7) {
        do {
          local_8c = local_38[uVar5];
          local_84 = local_38[uVar8];
          dVar2 = tchecker::dbm::sum(&local_8c,&local_84);
          poVar3 = local_80;
          if (dVar2 == (db_t)0x1) {
            if (!bVar1) {
              std::__ostream_insert<char,std::char_traits<char>>(local_80," & ",3);
            }
            local_88 = (uint)local_40;
            boost::container::dtl::
            flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_78,(key_type *)r);
            if ((pointer)local_78._0_8_ ==
                (pointer)(*(stored_size_type *)
                           ((long)&(r->super_flat_clock_variables_t).
                                   super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._index._key_map.m_flat_tree.m_data + 8) * 0x28 +
                         *(long *)&(r->super_flat_clock_variables_t).
                                   super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._index._key_map.m_flat_tree.m_data)) {
              this = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(this,"unknown variable ID");
LAB_00151a08:
              __cxa_throw(this,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            if ((pointer)local_78._0_8_ == (pointer)0x0) {
LAB_00151973:
              __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                            "reference boost::container::vec_iterator<std::pair<unsigned int, std::basic_string<char>> *, true>::operator*() const [Pointer = std::pair<unsigned int, std::basic_string<char>> *, IsConst = true]"
                           );
            }
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar3,(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(local_78._0_8_ + 8))->_M_dataplus)._M_p,
                                *(size_type *)(local_78._0_8_ + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=",1);
            local_88 = uVar4;
            boost::container::dtl::
            flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_78,(key_type *)r);
            if ((pointer)local_78._0_8_ ==
                (pointer)(*(stored_size_type *)
                           ((long)&(r->super_flat_clock_variables_t).
                                   super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._index._key_map.m_flat_tree.m_data + 8) * 0x28 +
                         *(long *)&(r->super_flat_clock_variables_t).
                                   super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._index._key_map.m_flat_tree.m_data)) {
              this = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(this,"unknown variable ID");
              goto LAB_00151a08;
            }
            if ((pointer)local_78._0_8_ == (pointer)0x0) goto LAB_00151973;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3,(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_78._0_8_ + 8))->_M_dataplus)._M_p,
                       *(size_type *)(local_78._0_8_ + 0x10));
            poVar3 = local_80;
            if ((int)local_8c >> 1 < 1) {
              if (-1 < (int)local_8c >> 1) goto LAB_001518e8;
              std::__ostream_insert<char,std::char_traits<char>>(local_80,"-",1);
              iVar6 = -((int)local_8c >> 1);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>(local_80,"+",1);
              iVar6 = (int)local_8c >> 1;
            }
            std::ostream::operator<<((ostream *)poVar3,iVar6);
LAB_001518e8:
            bVar1 = false;
          }
          else if (local_84 != (db_t)0x7ffffffe || local_8c != (db_t)0x7ffffffe) {
            if (!bVar1) {
              std::__ostream_insert<char,std::char_traits<char>>(local_80," & ",3);
            }
            if (local_84 != (db_t)0x7ffffffe) {
              auVar9 = std::ostream::operator<<((ostream *)poVar3,-((int)local_84 >> 1));
              tchecker::dbm::comparator_str_abi_cxx11_
                        ((string *)local_78,(dbm *)&local_84,auVar9._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (auVar9._0_8_,(char *)local_78._0_8_,local_78._8_8_);
              poVar3 = local_80;
              if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
                operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
                poVar3 = local_80;
              }
            }
            local_88 = (uint)local_40;
            boost::container::dtl::
            flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_78,(key_type *)r);
            if ((pointer)local_78._0_8_ ==
                (pointer)(*(stored_size_type *)
                           ((long)&(r->super_flat_clock_variables_t).
                                   super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._index._key_map.m_flat_tree.m_data + 8) * 0x28 +
                         *(long *)&(r->super_flat_clock_variables_t).
                                   super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._index._key_map.m_flat_tree.m_data)) {
              this = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(this,"unknown variable ID");
              goto LAB_00151a08;
            }
            if ((pointer)local_78._0_8_ == (pointer)0x0) goto LAB_00151973;
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar3,(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(local_78._0_8_ + 8))->_M_dataplus)._M_p,
                                *(size_type *)(local_78._0_8_ + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-",1);
            local_88 = uVar4;
            boost::container::dtl::
            flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_78,(key_type *)r);
            if ((pointer)local_78._0_8_ ==
                (pointer)(*(stored_size_type *)
                           ((long)&(r->super_flat_clock_variables_t).
                                   super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._index._key_map.m_flat_tree.m_data + 8) * 0x28 +
                         *(long *)&(r->super_flat_clock_variables_t).
                                   super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._index._key_map.m_flat_tree.m_data)) {
              this = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(this,"unknown variable ID");
              goto LAB_00151a08;
            }
            if ((pointer)local_78._0_8_ == (pointer)0x0) goto LAB_00151973;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3,(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_78._0_8_ + 8))->_M_dataplus)._M_p,
                       *(size_type *)(local_78._0_8_ + 0x10));
            if (local_8c != (db_t)0x7ffffffe) {
              tchecker::dbm::comparator_str_abi_cxx11_((string *)local_78,(dbm *)&local_8c,db);
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 (local_80,(char *)local_78._0_8_,local_78._8_8_);
              std::ostream::operator<<((ostream *)poVar3,(int)local_8c >> 1);
              if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
                operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
              }
            }
            goto LAB_001518e8;
          }
          uVar4 = uVar4 + 1;
          uVar8 = (ulong)((int)uVar8 + uVar7);
          uVar5 = uVar5 + 1;
        } while (uVar7 != uVar4);
      }
      uVar4 = local_50 + 1;
      uVar8 = (ulong)(uint)(local_4c + local_54);
      uVar5 = local_44 + local_54;
    } while (local_48 != uVar7);
  }
  poVar3 = local_80;
  std::__ostream_insert<char,std::char_traits<char>>(local_80,")",1);
  return poVar3;
}

Assistant:

std::ostream & output(std::ostream & os, tchecker::dbm::db_t const * rdbm, tchecker::reference_clock_variables_t const & r)
{
  tchecker::clock_id_t const rdim = r.size();
  bool first = true;

  os << "(";

  for (tchecker::clock_id_t i = 0; i < rdim; ++i) {
    for (tchecker::clock_id_t j = i + 1; j < rdim; ++j) {
      tchecker::dbm::db_t cij = RDBM(i, j), cji = RDBM(j, i);
      // vi == vj + k
      if (tchecker::dbm::sum(cij, cji) == tchecker::dbm::LE_ZERO) {
        if (!first)
          os << " & ";
        first = false;

        os << r.name(i) << "=" << r.name(j);
        tchecker::integer_t vij = tchecker::dbm::value(cij);
        if (vij > 0)
          os << "+" << tchecker::dbm::value(cij);
        else if (vij < 0)
          os << "-" << -tchecker::dbm::value(cij);
      }
      // k1 <= xi - xj <= k2
      else if ((cij != tchecker::dbm::LT_INFINITY) || (cji != tchecker::dbm::LT_INFINITY)) {
        if (!first)
          os << " & ";
        first = false;

        if (cji != tchecker::dbm::LT_INFINITY)
          os << -tchecker::dbm::value(cji) << tchecker::dbm::comparator_str(cji);

        os << r.name(i) << "-" << r.name(j);

        if (cij != tchecker::dbm::LT_INFINITY)
          os << tchecker::dbm::comparator_str(cij) << tchecker::dbm::value(cij);
      }
    }
  }

  os << ")";

  return os;
}